

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveUleftNoNZ(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *eps,
                number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *vec,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *rhs,int *rhsidx,int rhsn)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  uint *puVar2;
  int iVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  int *piVar11;
  cpp_dec_float<50U,_int,_void> *pcVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  cpp_dec_float<50U,_int,_void> *pcVar16;
  int iVar17;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<50U,_int,_void> local_1f8;
  uint local_1bc;
  cpp_dec_float<50U,_int,_void> local_1b8;
  cpp_dec_float<50U,_int,_void> local_178;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_140;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  int *local_128;
  int *local_120;
  pointer local_118;
  int *local_110;
  int *local_108;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_100;
  int *local_f8;
  int *local_f0;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_178.fpclass = cpp_dec_float_finite;
  local_178.prec_elem = 10;
  local_178.data._M_elems[0] = 0;
  local_178.data._M_elems[1] = 0;
  local_178.data._M_elems[2] = 0;
  local_178.data._M_elems[3] = 0;
  local_178.data._M_elems[4] = 0;
  local_178.data._M_elems[5] = 0;
  local_178.data._M_elems._24_5_ = 0;
  local_178.data._M_elems[7]._1_3_ = 0;
  local_178.data._M_elems[8] = 0;
  local_178.data._M_elems[9] = 0;
  local_178.exp = 0;
  local_178.neg = false;
  local_108 = (this->row).orig;
  local_f0 = (this->col).orig;
  local_f8 = (this->col).perm;
  if (0 < rhsn) {
    uVar8 = 0;
    do {
      iVar5 = local_f8[rhsidx[uVar8]];
      if (uVar8 == 0) {
        uVar10 = 0;
      }
      else {
        uVar14 = uVar8 & 0xffffffff;
        do {
          uVar15 = (uint)uVar14 - 1;
          uVar9 = uVar15 >> 1;
          uVar10 = (uint)uVar14;
          if (rhsidx[uVar9] <= iVar5) break;
          rhsidx[uVar14] = rhsidx[uVar9];
          uVar14 = (ulong)uVar9;
          uVar10 = uVar9;
        } while (1 < uVar15);
      }
      uVar8 = uVar8 + 1;
      rhsidx[(int)uVar10] = iVar5;
    } while (uVar8 != (uint)rhsn);
  }
  if (0 < rhsn) {
    local_118 = (this->u).row.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_120 = (this->u).row.idx;
    local_110 = (this->u).row.len;
    local_128 = (this->u).row.start;
    local_140 = this;
    local_138 = eps;
    local_130 = rhs;
    local_100 = vec;
    do {
      iVar17 = *rhsidx;
      local_1bc = rhsn - 1;
      iVar6 = rhsidx[(long)rhsn + -1];
      iVar5 = 1;
      iVar7 = 0;
      if (3 < rhsn) {
        iVar7 = 0;
        do {
          iVar3 = rhsidx[iVar5];
          iVar13 = rhsidx[(long)iVar5 + 1];
          piVar11 = rhsidx + iVar7;
          if (iVar3 < iVar13) {
            iVar7 = iVar5;
            iVar13 = iVar3;
            if (iVar6 <= iVar3) goto LAB_002b770c;
          }
          else {
            if (iVar6 <= iVar13) goto LAB_002b770c;
            iVar7 = iVar5 + 1;
          }
          *piVar11 = iVar13;
          iVar5 = iVar7 * 2 + 1;
        } while (iVar5 < (int)(rhsn - 2U));
      }
      if ((iVar5 < (int)local_1bc) && (rhsidx[iVar5] < iVar6)) {
        rhsidx[iVar7] = rhsidx[iVar5];
        iVar7 = iVar5;
      }
      piVar11 = rhsidx + iVar7;
LAB_002b770c:
      *piVar11 = iVar6;
      iVar5 = local_f0[iVar17];
      local_1b8.data._M_elems._32_8_ = *(undefined8 *)(local_130[iVar5].m_backend.data._M_elems + 8)
      ;
      local_1b8.data._M_elems._0_8_ = *(undefined8 *)local_130[iVar5].m_backend.data._M_elems;
      local_1b8.data._M_elems._8_8_ = *(undefined8 *)(local_130[iVar5].m_backend.data._M_elems + 2);
      puVar2 = local_130[iVar5].m_backend.data._M_elems + 4;
      local_1b8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      uVar4 = *(undefined8 *)(puVar2 + 2);
      local_1b8.data._M_elems._24_5_ = SUB85(uVar4,0);
      local_1b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_1b8.exp = local_130[iVar5].m_backend.exp;
      local_1b8.neg = local_130[iVar5].m_backend.neg;
      local_1b8.fpclass = local_130[iVar5].m_backend.fpclass;
      local_1b8.prec_elem = local_130[iVar5].m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&local_130[iVar5].m_backend,0);
      local_1f8.data._M_elems._32_5_ = local_1b8.data._M_elems._32_5_;
      local_1f8.data._M_elems[9]._1_3_ = local_1b8.data._M_elems[9]._1_3_;
      local_1f8.data._M_elems[4] = local_1b8.data._M_elems[4];
      local_1f8.data._M_elems[5] = local_1b8.data._M_elems[5];
      local_1f8.data._M_elems._24_5_ = local_1b8.data._M_elems._24_5_;
      local_1f8.data._M_elems[7]._1_3_ = local_1b8.data._M_elems[7]._1_3_;
      local_1f8.data._M_elems[0] = local_1b8.data._M_elems[0];
      local_1f8.data._M_elems[1] = local_1b8.data._M_elems[1];
      uVar4 = local_1f8.data._M_elems._0_8_;
      local_1f8.data._M_elems[2] = local_1b8.data._M_elems[2];
      local_1f8.data._M_elems[3] = local_1b8.data._M_elems[3];
      local_68.data._M_elems._0_8_ = *(undefined8 *)(local_138->m_backend).data._M_elems;
      local_68.data._M_elems._8_8_ = *(undefined8 *)((local_138->m_backend).data._M_elems + 2);
      local_68.data._M_elems._16_8_ = *(undefined8 *)((local_138->m_backend).data._M_elems + 4);
      local_68.data._M_elems._24_8_ = *(undefined8 *)((local_138->m_backend).data._M_elems + 6);
      local_68.data._M_elems._32_8_ = *(undefined8 *)((local_138->m_backend).data._M_elems + 8);
      local_68.exp = (local_138->m_backend).exp;
      local_68.neg = (local_138->m_backend).neg;
      local_68.fpclass = (local_138->m_backend).fpclass;
      local_68.prec_elem = (local_138->m_backend).prec_elem;
      local_1f8.exp = local_1b8.exp;
      local_1f8.neg = local_1b8.neg;
      local_1f8.fpclass = local_1b8.fpclass;
      local_1f8.prec_elem = local_1b8.prec_elem;
      if ((local_1b8.neg == true) &&
         (local_1f8.data._M_elems[0] = local_1b8.data._M_elems[0],
         local_1f8.data._M_elems[0] != 0 || local_1b8.fpclass != cpp_dec_float_finite)) {
        local_1f8.neg = false;
      }
      local_1f8.data._M_elems._0_8_ = uVar4;
      if ((local_68.fpclass != cpp_dec_float_NaN && local_1b8.fpclass != cpp_dec_float_NaN) &&
         (iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_1f8,&local_68), 0 < iVar5)) {
        iVar5 = local_108[iVar17];
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_1b8,
                   &(local_140->diag).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar5].m_backend);
        *(undefined8 *)local_100[iVar5].m_backend.data._M_elems = local_1b8.data._M_elems._0_8_;
        *(undefined8 *)(local_100[iVar5].m_backend.data._M_elems + 2) =
             local_1b8.data._M_elems._8_8_;
        puVar2 = local_100[iVar5].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = local_1b8.data._M_elems._16_8_;
        *(ulong *)(puVar2 + 2) =
             CONCAT35(local_1b8.data._M_elems[7]._1_3_,local_1b8.data._M_elems._24_5_);
        *(undefined8 *)(local_100[iVar5].m_backend.data._M_elems + 8) =
             local_1b8.data._M_elems._32_8_;
        local_100[iVar5].m_backend.exp = local_1b8.exp;
        local_100[iVar5].m_backend.neg = local_1b8.neg;
        local_100[iVar5].m_backend.fpclass = local_1b8.fpclass;
        local_100[iVar5].m_backend.prec_elem = local_1b8.prec_elem;
        iVar17 = local_110[iVar5];
        if (iVar17 != 0) {
          pcVar16 = &local_118[local_128[iVar5]].m_backend;
          piVar11 = local_120 + local_128[iVar5];
          do {
            iVar5 = *piVar11;
            pnVar1 = local_130 + iVar5;
            local_178.data._M_elems._32_8_ =
                 *(undefined8 *)(local_130[iVar5].m_backend.data._M_elems + 8);
            local_178.data._M_elems._0_8_ = *(undefined8 *)local_130[iVar5].m_backend.data._M_elems;
            local_178.data._M_elems._8_8_ =
                 *(undefined8 *)(local_130[iVar5].m_backend.data._M_elems + 2);
            puVar2 = local_130[iVar5].m_backend.data._M_elems + 4;
            local_178.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            uVar4 = *(undefined8 *)(puVar2 + 2);
            local_178.data._M_elems._24_5_ = SUB85(uVar4,0);
            local_178.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_178.exp = local_130[iVar5].m_backend.exp;
            local_178.neg = local_130[iVar5].m_backend.neg;
            local_178.fpclass = local_130[iVar5].m_backend.fpclass;
            local_178.prec_elem = local_130[iVar5].m_backend.prec_elem;
            if (local_178.fpclass == cpp_dec_float_NaN) {
LAB_002b798f:
              local_1f8.fpclass = cpp_dec_float_finite;
              local_1f8.prec_elem = 10;
              local_1f8.data._M_elems[0] = 0;
              local_1f8.data._M_elems[1] = 0;
              local_1f8.data._M_elems[2] = 0;
              local_1f8.data._M_elems[3] = 0;
              local_1f8.data._M_elems[4] = 0;
              local_1f8.data._M_elems[5] = 0;
              local_1f8.data._M_elems._24_5_ = 0;
              local_1f8.data._M_elems[7]._1_3_ = 0;
              local_1f8.data._M_elems._32_5_ = 0;
              local_1f8.data._M_elems[9]._1_3_ = 0;
              local_1f8.exp = 0;
              local_1f8.neg = false;
              pcVar12 = &local_1b8;
              if (&local_1f8 != pcVar16) {
                local_1f8.data._M_elems._32_5_ = local_1b8.data._M_elems._32_5_;
                local_1f8.data._M_elems[9]._1_3_ = local_1b8.data._M_elems[9]._1_3_;
                local_1f8.data._M_elems[4] = local_1b8.data._M_elems[4];
                local_1f8.data._M_elems[5] = local_1b8.data._M_elems[5];
                local_1f8.data._M_elems._24_5_ = local_1b8.data._M_elems._24_5_;
                local_1f8.data._M_elems[7]._1_3_ = local_1b8.data._M_elems[7]._1_3_;
                local_1f8.data._M_elems[0] = local_1b8.data._M_elems[0];
                local_1f8.data._M_elems[1] = local_1b8.data._M_elems[1];
                local_1f8.data._M_elems[2] = local_1b8.data._M_elems[2];
                local_1f8.data._M_elems[3] = local_1b8.data._M_elems[3];
                local_1f8.exp = local_1b8.exp;
                local_1f8.neg = local_1b8.neg;
                local_1f8.fpclass = local_1b8.fpclass;
                local_1f8.prec_elem = local_1b8.prec_elem;
                pcVar12 = pcVar16;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_1f8,pcVar12);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_178,&local_1f8);
              if (local_178.fpclass == cpp_dec_float_NaN) {
LAB_002b7a39:
                local_1f8.data._M_elems._32_5_ = local_178.data._M_elems._32_5_;
                local_1f8.data._M_elems[9]._1_3_ = local_178.data._M_elems[9]._1_3_;
                local_1f8.data._M_elems[4] = local_178.data._M_elems[4];
                local_1f8.data._M_elems[5] = local_178.data._M_elems[5];
                local_1f8.data._M_elems._24_5_ = local_178.data._M_elems._24_5_;
                local_1f8.data._M_elems[7]._1_3_ = local_178.data._M_elems[7]._1_3_;
                local_1f8.data._M_elems[0] = local_178.data._M_elems[0];
                local_1f8.data._M_elems[1] = local_178.data._M_elems[1];
                local_1f8.data._M_elems[2] = local_178.data._M_elems[2];
                local_1f8.data._M_elems[3] = local_178.data._M_elems[3];
                local_1f8.exp = local_178.exp;
                local_1f8.neg = local_178.neg;
                local_1f8.fpclass = local_178.fpclass;
                local_1f8.prec_elem = local_178.prec_elem;
              }
              else {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>(&local_1f8,0,(type *)0x0);
                iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_178,&local_1f8);
                if (iVar5 != 0) goto LAB_002b7a39;
                local_1f8.fpclass = cpp_dec_float_finite;
                local_1f8.prec_elem = 10;
                local_1f8.data._M_elems[0] = 0;
                local_1f8.data._M_elems[1] = 0;
                local_1f8.data._M_elems[2] = 0;
                local_1f8.data._M_elems[3] = 0;
                local_1f8.data._M_elems[4] = 0;
                local_1f8.data._M_elems[5] = 0;
                local_1f8.data._M_elems._24_5_ = 0;
                local_1f8.data._M_elems[7]._1_3_ = 0;
                local_1f8.data._M_elems._32_5_ = 0;
                local_1f8.data._M_elems[9]._1_3_ = 0;
                local_1f8.exp = 0;
                local_1f8.neg = false;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)&local_1f8,1e-100);
              }
              *(ulong *)((pnVar1->m_backend).data._M_elems + 8) =
                   CONCAT35(local_1f8.data._M_elems[9]._1_3_,local_1f8.data._M_elems._32_5_);
              *(undefined8 *)((pnVar1->m_backend).data._M_elems + 4) =
                   local_1f8.data._M_elems._16_8_;
              *(ulong *)((pnVar1->m_backend).data._M_elems + 6) =
                   CONCAT35(local_1f8.data._M_elems[7]._1_3_,local_1f8.data._M_elems._24_5_);
              *(undefined8 *)(pnVar1->m_backend).data._M_elems = local_1f8.data._M_elems._0_8_;
              *(undefined8 *)((pnVar1->m_backend).data._M_elems + 2) = local_1f8.data._M_elems._8_8_
              ;
              (pnVar1->m_backend).exp = local_1f8.exp;
              (pnVar1->m_backend).neg = local_1f8.neg;
              (pnVar1->m_backend).fpclass = local_1f8.fpclass;
              (pnVar1->m_backend).prec_elem = local_1f8.prec_elem;
              uVar4 = local_178.data._M_elems._16_8_;
            }
            else {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_1f8,0,(type *)0x0);
              iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_178,&local_1f8);
              if (iVar6 != 0) goto LAB_002b798f;
              local_e8.data._M_elems[7]._1_3_ = local_1b8.data._M_elems[7]._1_3_;
              local_e8.data._M_elems._24_5_ = local_1b8.data._M_elems._24_5_;
              local_e8.data._M_elems[0] = local_1b8.data._M_elems[0];
              local_e8.data._M_elems[1] = local_1b8.data._M_elems[1];
              uVar4 = local_e8.data._M_elems._0_8_;
              local_e8.data._M_elems[2] = local_1b8.data._M_elems[2];
              local_e8.data._M_elems[3] = local_1b8.data._M_elems[3];
              local_e8.data._M_elems[8] = local_1b8.data._M_elems[8];
              local_e8.data._M_elems[9] = local_1b8.data._M_elems[9];
              local_e8.data._M_elems[4] = local_1b8.data._M_elems[4];
              local_e8.data._M_elems[5] = local_1b8.data._M_elems[5];
              local_e8.exp = local_1b8.exp;
              local_e8.neg = local_1b8.neg;
              local_e8.fpclass = local_1b8.fpclass;
              local_e8.prec_elem = local_1b8.prec_elem;
              local_e8.data._M_elems[0] = local_1b8.data._M_elems[0];
              if (local_e8.data._M_elems[0] != 0 || local_1b8.fpclass != cpp_dec_float_finite) {
                local_e8.neg = (bool)(local_1b8.neg ^ 1);
              }
              local_1f8.fpclass = cpp_dec_float_finite;
              local_1f8.prec_elem = 10;
              local_1f8.data._M_elems[0] = 0;
              local_1f8.data._M_elems[1] = 0;
              local_1f8.data._M_elems[2] = 0;
              local_1f8.data._M_elems[3] = 0;
              local_1f8.data._M_elems[4] = 0;
              local_1f8.data._M_elems[5] = 0;
              local_1f8.data._M_elems._24_5_ = 0;
              local_1f8.data._M_elems[7]._1_3_ = 0;
              local_1f8.data._M_elems._32_5_ = 0;
              local_1f8.data._M_elems[9]._1_3_ = 0;
              local_1f8.exp = 0;
              local_1f8.neg = false;
              pcVar12 = &local_e8;
              if (&local_1f8 != pcVar16) {
                local_1f8.data._M_elems._32_5_ = local_1b8.data._M_elems._32_5_;
                local_1f8.data._M_elems[9]._1_3_ = local_1b8.data._M_elems[9]._1_3_;
                local_1f8.data._M_elems[4] = local_1b8.data._M_elems[4];
                local_1f8.data._M_elems[5] = local_1b8.data._M_elems[5];
                local_1f8.data._M_elems._24_5_ = local_1b8.data._M_elems._24_5_;
                local_1f8.data._M_elems[7]._1_3_ = local_1b8.data._M_elems[7]._1_3_;
                local_1f8.data._M_elems[0] = local_1b8.data._M_elems[0];
                local_1f8.data._M_elems[1] = local_1b8.data._M_elems[1];
                local_1f8.data._M_elems[2] = local_1b8.data._M_elems[2];
                local_1f8.data._M_elems[3] = local_1b8.data._M_elems[3];
                local_1f8.exp = local_1b8.exp;
                local_1f8.neg = local_e8.neg;
                local_1f8.fpclass = local_1b8.fpclass;
                local_1f8.prec_elem = local_1b8.prec_elem;
                pcVar12 = pcVar16;
              }
              local_e8.data._M_elems._0_8_ = uVar4;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_1f8,pcVar12);
              local_178.data._M_elems[9]._1_3_ = local_1f8.data._M_elems[9]._1_3_;
              local_178.data._M_elems._32_5_ = local_1f8.data._M_elems._32_5_;
              uVar4._0_4_ = local_1f8.data._M_elems[4];
              uVar4._4_4_ = local_1f8.data._M_elems[5];
              local_178.data._M_elems[4] = local_1f8.data._M_elems[4];
              local_178.data._M_elems[5] = local_1f8.data._M_elems[5];
              local_178.data._M_elems._24_5_ = local_1f8.data._M_elems._24_5_;
              local_178.data._M_elems[7]._1_3_ = local_1f8.data._M_elems[7]._1_3_;
              local_178.data._M_elems[0] = local_1f8.data._M_elems[0];
              local_178.data._M_elems[1] = local_1f8.data._M_elems[1];
              local_178.data._M_elems[2] = local_1f8.data._M_elems[2];
              local_178.data._M_elems[3] = local_1f8.data._M_elems[3];
              local_178.exp = local_1f8.exp;
              local_178.neg = local_1f8.neg;
              local_178.prec_elem = local_1f8.prec_elem;
              local_178.fpclass = local_1f8.fpclass;
              local_a8.data._M_elems._32_8_ =
                   *(undefined8 *)((local_138->m_backend).data._M_elems + 8);
              local_a8.data._M_elems._0_8_ = *(undefined8 *)(local_138->m_backend).data._M_elems;
              local_a8.data._M_elems._8_8_ =
                   *(undefined8 *)((local_138->m_backend).data._M_elems + 2);
              local_a8.data._M_elems._16_8_ =
                   *(undefined8 *)((local_138->m_backend).data._M_elems + 4);
              local_a8.data._M_elems._24_8_ =
                   *(undefined8 *)((local_138->m_backend).data._M_elems + 6);
              local_a8.exp = (local_138->m_backend).exp;
              local_a8.neg = (local_138->m_backend).neg;
              local_a8.fpclass = (local_138->m_backend).fpclass;
              local_a8.prec_elem = (local_138->m_backend).prec_elem;
              if ((local_1f8.neg == true) &&
                 (local_1f8.data._M_elems[0] != 0 || local_1f8.fpclass != cpp_dec_float_finite)) {
                local_1f8.neg = false;
              }
              if ((local_a8.fpclass != cpp_dec_float_NaN && local_1f8.fpclass != cpp_dec_float_NaN)
                 && (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&local_1f8,&local_a8),
                    uVar4 = local_178.data._M_elems._16_8_, 0 < iVar6)) {
                *(undefined8 *)((pnVar1->m_backend).data._M_elems + 8) =
                     local_178.data._M_elems._32_8_;
                *(undefined8 *)((pnVar1->m_backend).data._M_elems + 4) =
                     local_178.data._M_elems._16_8_;
                *(ulong *)((pnVar1->m_backend).data._M_elems + 6) =
                     CONCAT35(local_178.data._M_elems[7]._1_3_,local_178.data._M_elems._24_5_);
                *(undefined8 *)(pnVar1->m_backend).data._M_elems = local_178.data._M_elems._0_8_;
                *(undefined8 *)((pnVar1->m_backend).data._M_elems + 2) =
                     local_178.data._M_elems._8_8_;
                (pnVar1->m_backend).exp = local_178.exp;
                (pnVar1->m_backend).neg = local_178.neg;
                (pnVar1->m_backend).fpclass = local_178.fpclass;
                (pnVar1->m_backend).prec_elem = local_178.prec_elem;
                iVar5 = local_f8[iVar5];
                uVar10 = local_1bc;
                if (0 < (int)local_1bc) {
                  do {
                    uVar9 = uVar10 - 1;
                    uVar15 = uVar9 >> 1;
                    if (rhsidx[uVar15] <= iVar5) break;
                    rhsidx[uVar10] = rhsidx[uVar15];
                    uVar10 = uVar15;
                  } while (1 < uVar9);
                }
                local_1bc = local_1bc + 1;
                rhsidx[(int)uVar10] = iVar5;
              }
            }
            local_178.data._M_elems._16_8_ = uVar4;
            piVar11 = piVar11 + 1;
            pcVar16 = pcVar16 + 1;
            iVar17 = iVar17 + -1;
          } while (iVar17 != 0);
        }
      }
      rhsn = local_1bc;
    } while (0 < (int)local_1bc);
  }
  return;
}

Assistant:

void CLUFactor<R>::solveUleftNoNZ(R eps, R* vec,
                                  R* rhs, int* rhsidx, int rhsn)
{
   R x, y;
   int i, j, k, r, c;
   int* rorig, *corig, *cperm;
   int* ridx, *rlen, *rbeg, *idx;
   R* rval, *val;

   rorig = row.orig;
   corig = col.orig;
   cperm = col.perm;

   /*  move rhsidx to a heap
    */

   for(i = 0; i < rhsn;)
      enQueueMin(rhsidx, &i, cperm[rhsidx[i]]);

   ridx = u.row.idx;

   rval = u.row.val.data();

   rlen = u.row.len;

   rbeg = u.row.start;

   while(rhsn > 0)
   {
      i = deQueueMin(rhsidx, &rhsn);
      assert(i >= 0 && i < thedim);
      c = corig[i];
      assert(c >= 0 && c < thedim);
      x = rhs[c];
      rhs[c] = 0;

      if(isNotZero(x, eps))
      {
         r = rorig[i];
         assert(r >= 0 && r < thedim);
         x *= diag[r];
         vec[r] = x;
         k = rbeg[r];
         assert(k >= 0 && k < u.row.size);
         idx = &ridx[k];
         val = &rval[k];

         for(int m = rlen[r]; m; --m)
         {
            j = *idx++;
            assert(j >= 0 && j < thedim);
            y = rhs[j];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[j] = y;
                  enQueueMin(rhsidx, &rhsn, cperm[j]);
               }
            }
            else
            {
               y -= x * (*val++);
               rhs[j] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
   }
}